

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_export.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
__thiscall duckdb::PhysicalExport::GetGlobalSourceState(PhysicalExport *this,ClientContext *context)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x58);
  *(undefined1 *)(pp_Var1 + 1) = 1;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__GlobalSourceState_0199ba88;
  *(undefined1 *)(pp_Var1 + 10) = 0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var1;
  return (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>)
         (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>)
         this;
}

Assistant:

unique_ptr<GlobalSourceState> PhysicalExport::GetGlobalSourceState(ClientContext &context) const {
	return make_uniq<ExportSourceState>();
}